

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*>(ArgumentParser *this,char *f_args)

{
  size_t *psVar1;
  argument_it it;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffffc8;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_1UL> local_30;
  
  local_30._M_elems[0]._M_len = strlen(f_args);
  local_30._M_elems[0]._M_str = f_args;
  it._M_node = &std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
                _M_create_node<std::__cxx11::string&,std::array<std::basic_string_view<char,std::char_traits<char>>,1ul>>
                          ((list<argparse::Argument,std::allocator<argparse::Argument>> *)
                           &this->m_optional_arguments,&this->m_prefix_chars,&local_30)->
                super__List_node_base;
  std::__detail::_List_node_base::_M_hook(it._M_node);
  psVar1 = &(this->m_optional_arguments).
            super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (((ulong)it._M_node[0x15]._M_next & 2) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->m_positional_arguments,(int)&this->m_positional_arguments,
               (__off64_t *)&this->m_optional_arguments,(int)it._M_node,in_R8,in_R9,
               in_stack_ffffffffffffffc8);
  }
  index_argument(this,it);
  return (Argument *)(it._M_node + 1);
}

Assistant:

Argument &add_argument(Targs... f_args) {
    using array_of_sv = std::array<std::string_view, sizeof...(Targs)>;
    auto argument =
        m_optional_arguments.emplace(std::cend(m_optional_arguments),
                                     m_prefix_chars, array_of_sv{f_args...});

    if (!argument->m_is_optional) {
      m_positional_arguments.splice(std::cend(m_positional_arguments),
                                    m_optional_arguments, argument);
    }

    index_argument(argument);
    return *argument;
  }